

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  float *pfVar9;
  Layer *pLVar10;
  float fVar11;
  uint uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined8 uVar20;
  int iVar21;
  undefined1 uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  float fVar28;
  undefined4 *puVar29;
  int iVar30;
  int iVar31;
  undefined1 (*pauVar32) [16];
  int iVar33;
  undefined1 (*pauVar34) [16];
  ulong uVar35;
  int iVar36;
  undefined4 uVar37;
  long lVar38;
  iterator iVar39;
  uint uVar40;
  pointer pfVar41;
  Option *opt_00;
  int iVar42;
  long lVar43;
  float *pfVar44;
  ulong uVar45;
  bool bVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  __m128 min;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  __m128 _b;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  __m128 max;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  ulong local_2f0;
  float *local_2e0;
  undefined1 local_2d8 [40];
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  int iStack_2a0;
  undefined4 uStack_29c;
  size_t local_298;
  ulong local_290;
  ulong local_288;
  float local_27c;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  ulong local_1c8;
  pointer local_1c0;
  int *local_1b8;
  Allocator *local_1b0;
  int local_1a8;
  Allocator *local_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  undefined4 local_188;
  ulong local_180;
  Mat local_178;
  size_type local_130;
  long local_128;
  void *local_120;
  int *local_118;
  Allocator *local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined4 local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_178.c = bottom_blob->c;
  local_178.elempack = bottom_blob->elempack;
  local_178.elemsize = bottom_blob->elemsize;
  iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar36 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar3 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar4 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount = bottom_blob->refcount;
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178.h = bottom_blob->h;
  local_178.d = bottom_blob->d;
  local_178.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (local_178.elempack == 0 || ((int)local_178.elemsize * 8) / local_178.elempack != 8) {
    uVar45 = (long)(local_178.elempack * local_178.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_178.elempack * local_178.c,4,(Allocator *)0x0);
    lVar27 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar27) {
      pvVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar38 = 0;
      puVar29 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar45) {
          uVar37 = *(undefined4 *)((long)pvVar5 + lVar38 * 4);
          uVar35 = uVar45 & 0xffffffff;
          do {
            *puVar29 = uVar37;
            puVar29 = puVar29 + 1;
            uVar40 = (int)uVar35 - 1;
            uVar35 = (ulong)uVar40;
          } while (uVar40 != 0);
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != lVar27);
    }
    uVar13 = opt->lightmode;
    uVar14 = opt->use_shader_pack8;
    uVar15 = opt->use_subgroup_ops;
    uVar16 = opt->use_reserved_0;
    uVar17 = opt->num_threads;
    local_2d8._4_4_ = uVar17;
    local_2d8[3] = uVar16;
    local_2d8[2] = uVar15;
    local_2d8[1] = uVar14;
    local_2d8[0] = uVar13;
    local_2d8._16_8_ = opt->workspace_allocator;
    local_2d8._24_4_ = opt->openmp_blocktime;
    local_2d8[0x1c] = opt->use_winograd_convolution;
    local_2d8[0x1d] = opt->use_sgemm_convolution;
    local_2d8[0x1e] = opt->use_int8_inference;
    local_2d8[0x1f] = opt->use_vulkan_compute;
    local_2d8[0x20] = opt->use_bf16_storage;
    local_2d8[0x21] = opt->use_fp16_packed;
    local_2d8[0x22] = opt->use_fp16_storage;
    local_2d8[0x23] = opt->use_fp16_arithmetic;
    local_2d8[0x24] = opt->use_int8_packed;
    local_2d8[0x25] = opt->use_int8_storage;
    local_2d8[0x26] = opt->use_int8_arithmetic;
    local_2d8[0x27] = opt->use_packing_layout;
    uStack_2b0._0_4_ = opt->vulkan_device_index;
    unique0x00006d0c = opt->use_reserved_1;
    unique0x00006d0d = opt->use_image_storage;
    unique0x00006d0e = opt->use_tensor_storage;
    unique0x00006d0f = opt->use_reserved_2;
    uStack_2a8._0_4_ = opt->flush_denormals;
    unique0x00006d14 = opt->use_local_pool_allocator;
    unique0x00006d15 = opt->use_shader_local_memory;
    unique0x00006d16 = opt->use_cooperative_matrix;
    unique0x00006d17 = opt->use_winograd23_convolution;
    unique0x00006d18 = opt->use_winograd43_convolution;
    unique0x00006d19 = opt->use_winograd63_convolution;
    unique0x00006d1a = opt->use_a53_a55_optimized_kernel;
    unique0x00006d1b = opt->use_fp16_uniform;
    unique0x00006d1c = opt->use_int8_uniform;
    unique0x00006d1d = opt->use_reserved_9;
    unique0x00006d1e = opt->use_reserved_10;
    unique0x00006d1f = opt->use_reserved_11;
    local_2d8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_178,&local_228,(Option *)local_2d8);
    bVar46 = local_178.data == (void *)0x0;
    lVar27 = (long)local_178.c * local_178.cstep;
    piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar31 = -100;
    if (bVar46 || lVar27 == 0) goto LAB_003f0eea;
  }
  local_228.cstep = 0;
  local_228.data = (undefined4 *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_178,&local_228,opt);
  iVar21 = local_228.w;
  iVar23 = local_228.elempack;
  iVar31 = -100;
  if (((undefined4 *)local_228.data != (undefined4 *)0x0) &&
     (local_228.cstep * (long)local_228.c != 0)) {
    iVar33 = (~((iVar33 + -1) * iVar36) + local_228.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar36 = iVar33 + 1;
    uVar45 = (long)(~((iVar42 + -1) * iVar3) + local_228.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_230 = uVar45 & 0xffffffff;
    iVar42 = (int)uVar45 + 1;
    uVar40 = local_228.elempack * local_228.c;
    if ((uVar40 == (this->super_ConvolutionDepthWise).group) &&
       (uVar40 == (this->super_ConvolutionDepthWise).num_output)) {
      uVar26 = 8;
      if (opt->use_packing_layout == false) {
        uVar26 = 1;
      }
      if ((uVar40 & 7) != 0) {
        uVar26 = 1;
      }
      iVar3 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar12 = uVar26 * 4;
      if (100 < iVar3) {
        uVar12 = uVar26;
      }
      local_290 = (long)local_228.c;
      Mat::create(top_blob,iVar36,iVar42,(int)uVar40 / (int)uVar26,(ulong)uVar12,uVar26,
                  opt->blob_allocator);
      iVar31 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar31 = 0;
        if (iVar23 == 1) {
          iVar42 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar40 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar40;
          auVar148._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar148._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar148._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar148._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar173._8_4_ = 1;
          auVar173._0_8_ = 0x100000001;
          auVar173._12_4_ = 1;
          uVar26 = (this->super_ConvolutionDepthWise).activation_type;
          auVar160._0_8_ = auVar148._0_8_ ^ 0x100000001;
          auVar160._8_4_ = auVar148._8_4_ ^ 1;
          auVar160._12_4_ = auVar148._12_4_ ^ 1;
          if ((1 < uVar26 || (uVar40 != 3 || iVar42 != 3)) || auVar160 != (undefined1  [16])0x0) {
            auVar173 = vpcmpeqd_avx(auVar148,auVar173);
            uVar37 = vmovmskps_avx(auVar173);
            if (((uVar40 != 3 || iVar42 != 3) || 1 < uVar26) ||
                ((auVar148._12_4_ != 2 || auVar148._8_4_ != 2) || (~(byte)uVar37 & 3) != 0)) {
              local_290 = CONCAT44(local_290._4_4_,uVar40 * iVar42);
              local_130 = (size_type)(int)(uVar40 * iVar42);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_2d8,local_130,
                         (allocator_type *)&local_278);
              uVar18 = local_2d8._0_8_;
              iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar42) {
                iVar36 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar31 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar23 = (this->super_ConvolutionDepthWise).dilation_w * iVar31;
                iVar24 = 0;
                fVar28 = 0.0;
                iVar30 = 0;
                do {
                  if (0 < iVar31) {
                    lVar27 = 0;
                    do {
                      *(float *)(local_2d8._0_8_ + (iVar30 + lVar27) * 4) = fVar28;
                      fVar28 = (float)((int)fVar28 + (this->super_ConvolutionDepthWise).dilation_w);
                      iVar31 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar27 = lVar27 + 1;
                    } while ((int)lVar27 < iVar31);
                    iVar30 = iVar30 + (int)lVar27;
                    iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  fVar28 = (float)((int)fVar28 + (iVar21 * iVar36 - iVar23));
                  iVar24 = iVar24 + 1;
                } while (iVar24 < iVar42);
              }
              iVar42 = (this->super_ConvolutionDepthWise).group;
              pfVar41 = (pointer)local_2d8._0_8_;
              if (0 < iVar42) {
                uVar45 = local_290 & 0xffffffff;
                lVar27 = 0;
                auVar79 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                lVar38 = 0;
                iVar36 = (int)local_290;
                do {
                  pvVar5 = local_228.data;
                  if (-1 < (int)local_230) {
                    lVar43 = local_228.cstep * lVar38 * local_228.elemsize;
                    pfVar44 = (float *)(top_blob->elemsize * lVar38 * top_blob->cstep +
                                       (long)top_blob->data);
                    local_288 = (long)local_228.w * local_228.elemsize;
                    pvVar6 = (this->weight_data_tm).data;
                    local_1c8 = 0;
                    local_2e0 = pfVar44;
                    local_128 = lVar27;
                    do {
                      if (-1 < iVar33) {
                        local_1d8 = (undefined1  [8])(long)(int)local_1c8;
                        iVar42 = 0;
                        do {
                          fVar28 = 0.0;
                          fVar47 = 0.0;
                          if (0 < iVar36) {
                            uVar35 = 0;
                            iVar31 = 0;
                            do {
                              iVar31 = iVar31 + (int)*(char *)((long)pvVar6 + uVar35 + lVar27) *
                                                (int)*(char *)((long)pvVar5 +
                                                              (long)(int)*(pointer)(uVar18 + uVar35 
                                                  * 4) + (long)(this->super_ConvolutionDepthWise).
                                                               stride_h * (long)local_1d8 *
                                                         local_288 +
                                                         (long)iVar42 *
                                                         (long)(this->super_ConvolutionDepthWise).
                                                               stride_w + lVar43);
                              uVar35 = uVar35 + 1;
                            } while (uVar45 != uVar35);
                            fVar47 = (float)iVar31;
                          }
                          fVar1 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar38 * 4);
                          if (fVar1 != 0.0) {
                            fVar28 = 1.0 / (fVar1 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar38 * 4));
                          }
                          fVar28 = fVar28 * fVar47;
                          if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                            fVar28 = fVar28 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bias_data.data + lVar38 * 4);
                          }
                          auVar148 = ZEXT416((uint)fVar28);
                          fVar47 = fVar28;
                          switch((this->super_ConvolutionDepthWise).activation_type) {
                          case 1:
                            auVar148 = vmaxss_avx(auVar148,ZEXT416(0));
                            fVar47 = auVar148._0_4_;
                            break;
                          case 2:
                            auVar148 = vcmpss_avx(ZEXT816(0) << 0x20,auVar148,1);
                            auVar70._8_4_ = 0x3f800000;
                            auVar70._0_8_ = 0x3f8000003f800000;
                            auVar70._12_4_ = 0x3f800000;
                            auVar148 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                              activation_params.data),auVar70,
                                                     auVar148);
                            fVar47 = auVar148._0_4_ * fVar28;
                            break;
                          case 3:
                            puVar8 = (uint *)(this->super_ConvolutionDepthWise).activation_params.
                                             data;
                            fVar28 = (float)puVar8[1];
                            auVar148 = vmaxss_avx(auVar148,ZEXT416(*puVar8));
                            fVar47 = auVar148._0_4_;
                            if (fVar28 < auVar148._0_4_) {
                              fVar47 = fVar28;
                            }
                            break;
                          case 4:
                            auVar148 = vminss_avx(auVar148,ZEXT416(0x42b0c0a5));
                            auVar54._0_4_ = auVar148._0_4_ ^ auVar79._0_4_;
                            auVar54._4_4_ = auVar148._4_4_ ^ auVar79._4_4_;
                            auVar54._8_4_ = auVar148._8_4_ ^ auVar79._8_4_;
                            auVar54._12_4_ = auVar148._12_4_ ^ auVar79._12_4_;
                            auVar148 = vcmpss_avx(auVar148,ZEXT416(0xc2b0c0a5),1);
                            auVar69._8_4_ = 0x42b0c0a5;
                            auVar69._0_8_ = 0x42b0c0a542b0c0a5;
                            auVar69._12_4_ = 0x42b0c0a5;
                            auVar148 = vblendvps_avx(auVar54,auVar69,auVar148);
                            fVar28 = expf(auVar148._0_4_);
                            auVar79 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            iVar36 = (int)local_290;
                            fVar47 = 1.0 / (fVar28 + 1.0);
                            break;
                          case 5:
                            local_27c = fVar28;
                            fVar28 = expf(fVar28);
                            fVar28 = logf(fVar28 + 1.0);
                            fVar28 = tanhf(fVar28);
                            auVar79 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            iVar36 = (int)local_290;
                            fVar47 = fVar28 * local_27c;
                            break;
                          case 6:
                            pfVar9 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                              data;
                            fVar1 = *pfVar9;
                            fVar2 = pfVar9[1];
                            fVar72 = (float)((uint)fVar2 ^ auVar79._0_4_) / fVar1;
                            fVar47 = 0.0;
                            if ((fVar72 <= fVar28) &&
                               (fVar47 = fVar28, fVar28 <= fVar72 + 1.0 / fVar1)) {
                              auVar148 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar148,
                                                         ZEXT416((uint)fVar2));
                              fVar47 = auVar148._0_4_ * fVar28;
                            }
                          }
                          if (iVar3 < 0x65) {
                            *pfVar44 = fVar47;
                            pfVar44 = pfVar44 + 1;
                          }
                          else {
                            fVar47 = fVar47 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               top_blob_int8_scales.data +
                                                        lVar38 * 4);
                            auVar148 = vandps_avx(ZEXT416((uint)fVar47),auVar79._0_16_);
                            auVar71._8_4_ = 0x3effffff;
                            auVar71._0_8_ = 0x3effffff3effffff;
                            auVar71._12_4_ = 0x3effffff;
                            auVar148 = vorps_avx(auVar148,auVar71);
                            auVar148 = ZEXT416((uint)(fVar47 + auVar148._0_4_));
                            auVar148 = vroundss_avx(auVar148,auVar148,0xb);
                            iVar31 = (int)auVar148._0_4_;
                            if (iVar31 < -0x7e) {
                              iVar31 = -0x7f;
                            }
                            uVar22 = (undefined1)iVar31;
                            if (0x7e < iVar31) {
                              uVar22 = 0x7f;
                            }
                            *(undefined1 *)local_2e0 = uVar22;
                            local_2e0 = (float *)((long)local_2e0 + 1);
                          }
                          bVar46 = iVar42 != iVar33;
                          iVar42 = iVar42 + 1;
                        } while (bVar46);
                      }
                      iVar42 = (int)local_1c8;
                      local_1c8 = (ulong)(iVar42 + 1);
                    } while (iVar42 != (int)local_230);
                    iVar42 = (this->super_ConvolutionDepthWise).group;
                    lVar27 = local_128;
                  }
                  lVar38 = lVar38 + 1;
                  lVar27 = lVar27 + local_130;
                } while (lVar38 < iVar42);
                pfVar41 = (pointer)local_2d8._0_8_;
              }
              if (pfVar41 != (pointer)0x0) {
                uVar45 = local_2d8._16_8_ - (long)pfVar41;
                goto LAB_003efdb6;
              }
              goto LAB_003f0dbe;
            }
            if (iVar3 < 0x65) {
              local_2d8._0_16_ = ZEXT816(0) << 0x20;
              local_2d8._16_8_ = (Allocator *)0x0;
              iVar33 = (this->super_ConvolutionDepthWise).group;
              if (0 < iVar33) {
                lVar27 = 0;
                do {
                  fVar28 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar27 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar27 * 4));
                  local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar28);
                  if (local_2d8._8_8_ == local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,
                               (iterator)local_2d8._8_8_,(float *)&local_278);
                    iVar33 = (this->super_ConvolutionDepthWise).group;
                  }
                  else {
                    *(float *)local_2d8._8_8_ = fVar28;
                    local_2d8._8_8_ = (float *)(local_2d8._8_8_ + 4);
                  }
                  lVar27 = lVar27 + 1;
                } while (lVar27 < iVar33);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_d8,(vector<float,_std::allocator<float>_> *)local_2d8);
              convdw3x3s2_int8_dequant_sse
                        (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_d8,opt_00);
            }
            else {
              local_2d8._0_16_ = ZEXT816(0) << 0x20;
              local_2d8._16_8_ = (Allocator *)0x0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar27 = 0;
                do {
                  fVar28 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar27 * 4);
                  fVar47 = 0.0;
                  if (fVar28 != 0.0) {
                    fVar47 = 1.0 / (fVar28 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar27 * 4));
                  }
                  local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar47);
                  local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar27 * 4));
                  if (local_2d8._8_8_ == local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,
                               (iterator)local_2d8._8_8_,(float *)&local_278);
                    iVar39._M_current = (float *)local_2d8._8_8_;
                  }
                  else {
                    *(float *)local_2d8._8_8_ = fVar47;
                    iVar39._M_current = (float *)(local_2d8._8_8_ + 4);
                    local_2d8._8_8_ = iVar39._M_current;
                  }
                  if (iVar39._M_current == (float *)local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,iVar39,
                               (float *)&local_1c0);
                  }
                  else {
                    *iVar39._M_current = local_1c0._0_4_;
                    local_2d8._8_8_ = iVar39._M_current + 1;
                  }
                  lVar27 = lVar27 + 1;
                } while (lVar27 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2d8);
              convdw3x3s2_int8_requant_sse
                        (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_c0,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
          }
          else if (iVar3 < 0x65) {
            local_2d8._0_16_ = ZEXT816(0) << 0x20;
            local_2d8._16_8_ = (Allocator *)0x0;
            iVar33 = (this->super_ConvolutionDepthWise).group;
            if (0 < iVar33) {
              lVar27 = 0;
              do {
                fVar28 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar27 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar27 * 4));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar28);
                if (local_2d8._8_8_ == local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,
                             (iterator)local_2d8._8_8_,(float *)&local_278);
                  iVar33 = (this->super_ConvolutionDepthWise).group;
                }
                else {
                  *(float *)local_2d8._8_8_ = fVar28;
                  local_2d8._8_8_ = (float *)(local_2d8._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < iVar33);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2d8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2d8._0_16_ = ZEXT816(0) << 0x20;
            local_2d8._16_8_ = (Allocator *)0x0;
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar27 = 0;
              do {
                fVar28 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar27 * 4);
                fVar47 = 0.0;
                if (fVar28 != 0.0) {
                  fVar47 = 1.0 / (fVar28 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar27 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar47);
                local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar27 * 4));
                if (local_2d8._8_8_ == local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,
                             (iterator)local_2d8._8_8_,(float *)&local_278);
                  iVar39._M_current = (float *)local_2d8._8_8_;
                }
                else {
                  *(float *)local_2d8._8_8_ = fVar47;
                  iVar39._M_current = (float *)(local_2d8._8_8_ + 4);
                  local_2d8._8_8_ = iVar39._M_current;
                }
                if (iVar39._M_current == (float *)local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,iVar39,
                             (float *)&local_1c0);
                }
                else {
                  *iVar39._M_current = local_1c0._0_4_;
                  local_2d8._8_8_ = iVar39._M_current + 1;
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2d8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
          }
          pLVar10 = this->activation;
          if (pLVar10 == (Layer *)0x0) goto LAB_003f0dbe;
          (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          iVar31 = 0;
        }
        else if (iVar23 == 8) {
          uVar45 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_2d8,uVar45,
                     (allocator_type *)&local_278);
          iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
          if (0 < iVar42) {
            iVar36 = (this->super_ConvolutionDepthWise).dilation_h;
            iVar31 = (this->super_ConvolutionDepthWise).kernel_w;
            iVar23 = (this->super_ConvolutionDepthWise).dilation_w * iVar31;
            iVar24 = 0;
            fVar28 = 0.0;
            iVar30 = 0;
            do {
              if (0 < iVar31) {
                lVar27 = 0;
                do {
                  *(float *)(local_2d8._0_8_ + (iVar24 + lVar27) * 4) = fVar28;
                  fVar28 = (float)((int)fVar28 + (this->super_ConvolutionDepthWise).dilation_w);
                  iVar31 = (this->super_ConvolutionDepthWise).kernel_w;
                  lVar27 = lVar27 + 1;
                } while ((int)lVar27 < iVar31);
                iVar24 = iVar24 + (int)lVar27;
                iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
              }
              fVar28 = (float)((int)fVar28 + (iVar21 * iVar36 - iVar23));
              iVar30 = iVar30 + 1;
            } while (iVar30 < iVar42);
          }
          if (0 < (int)local_290) {
            local_27c = (float)((int)uVar45 * 8);
            iVar42 = 0;
            local_2f0 = 0;
            do {
              if (-1 < (int)local_230) {
                pauVar32 = (undefined1 (*) [16])
                           (top_blob->elemsize * local_2f0 * top_blob->cstep + (long)top_blob->data)
                ;
                pvVar5 = (this->weight_data_tm).data;
                pauVar34 = pauVar32;
                uVar35 = 0;
                do {
                  local_288 = uVar35;
                  iVar36 = (int)local_288;
                  if (-1 < iVar33) {
                    iVar31 = 0;
                    do {
                      if ((int)uVar45 < 1) {
                        auVar173 = ZEXT816(0) << 0x40;
                        auVar148 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar79 = ZEXT1664((undefined1  [16])0x0);
                        uVar35 = 0;
                        auVar86 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          auVar87._8_8_ = 0;
                          auVar87._0_8_ =
                               *(ulong *)((long)local_228.data +
                                         (long)(int)*(pointer)(local_2d8._0_8_ + uVar35 * 4) * 8 +
                                         (long)(this->super_ConvolutionDepthWise).stride_h *
                                         (long)iVar36 * (long)local_228.w * local_228.elemsize +
                                         (long)((this->super_ConvolutionDepthWise).stride_w * iVar31
                                               * 8) +
                                         local_228.cstep * local_2f0 * local_228.elemsize);
                          auVar148 = vpcmpgtb_avx((undefined1  [16])0x0,auVar87);
                          auVar173 = vpunpcklbw_avx(auVar87,auVar148);
                          auVar145._8_8_ = 0;
                          auVar145._0_8_ = *(ulong *)((long)pvVar5 + uVar35 * 8 + (long)iVar42);
                          auVar148 = vpcmpgtb_avx((undefined1  [16])0x0,auVar145);
                          auVar148 = vpunpcklbw_avx(auVar145,auVar148);
                          auVar160 = vpmullw_avx(auVar148,auVar173);
                          auVar173 = vpmulhw_avx(auVar148,auVar173);
                          auVar148 = vpunpcklwd_avx(auVar160,auVar173);
                          auVar148 = vpaddd_avx(auVar148,auVar79._0_16_);
                          auVar79 = ZEXT1664(auVar148);
                          auVar173 = vpunpckhwd_avx(auVar160,auVar173);
                          auVar173 = vpaddd_avx(auVar86._0_16_,auVar173);
                          auVar86 = ZEXT1664(auVar173);
                          uVar35 = uVar35 + 1;
                        } while ((uVar45 & 0xffffffff) != uVar35);
                        auVar148 = vcvtdq2ps_avx(auVar148);
                        auVar173 = vcvtdq2ps_avx(auVar173);
                      }
                      pvVar6 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                      pvVar7 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                      auVar160 = *(undefined1 (*) [16])((long)pvVar6 + local_2f0 * 0x20);
                      auVar54 = *(undefined1 (*) [16])((long)pvVar6 + local_2f0 * 0x20 + 0x10);
                      pfVar44 = (float *)((long)pvVar7 + local_2f0 * 0x20);
                      auVar157._0_4_ = auVar160._0_4_ * *pfVar44;
                      auVar157._4_4_ = auVar160._4_4_ * pfVar44[1];
                      auVar157._8_4_ = auVar160._8_4_ * pfVar44[2];
                      auVar157._12_4_ = auVar160._12_4_ * pfVar44[3];
                      auVar69 = vrcpps_avx(auVar157);
                      pfVar44 = (float *)((long)pvVar7 + local_2f0 * 0x20 + 0x10);
                      auVar165._0_4_ = auVar54._0_4_ * *pfVar44;
                      auVar165._4_4_ = auVar54._4_4_ * pfVar44[1];
                      auVar165._8_4_ = auVar54._8_4_ * pfVar44[2];
                      auVar165._12_4_ = auVar54._12_4_ * pfVar44[3];
                      auVar70 = vrcpps_avx(auVar165);
                      auVar160 = vcmpps_avx(auVar160,(undefined1  [16])0x0,4);
                      auVar160 = vandps_avx(auVar69,auVar160);
                      auVar80._0_4_ = auVar160._0_4_ * auVar148._0_4_;
                      auVar80._4_4_ = auVar160._4_4_ * auVar148._4_4_;
                      auVar80._8_4_ = auVar160._8_4_ * auVar148._8_4_;
                      auVar80._12_4_ = auVar160._12_4_ * auVar148._12_4_;
                      auVar148 = vcmpps_avx(auVar54,(undefined1  [16])0x0,4);
                      auVar148 = vandps_avx(auVar70,auVar148);
                      auVar73._0_4_ = auVar148._0_4_ * auVar173._0_4_;
                      auVar73._4_4_ = auVar148._4_4_ * auVar173._4_4_;
                      auVar73._8_4_ = auVar148._8_4_ * auVar173._8_4_;
                      auVar73._12_4_ = auVar148._12_4_ * auVar173._12_4_;
                      if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                        pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
                        pfVar44 = (float *)((long)pvVar6 + local_2f0 * 0x20);
                        auVar80._0_4_ = auVar80._0_4_ + *pfVar44;
                        auVar80._4_4_ = auVar80._4_4_ + pfVar44[1];
                        auVar80._8_4_ = auVar80._8_4_ + pfVar44[2];
                        auVar80._12_4_ = auVar80._12_4_ + pfVar44[3];
                        pfVar44 = (float *)((long)pvVar6 + local_2f0 * 0x20 + 0x10);
                        auVar73._0_4_ = auVar73._0_4_ + *pfVar44;
                        auVar73._4_4_ = auVar73._4_4_ + pfVar44[1];
                        auVar73._8_4_ = auVar73._8_4_ + pfVar44[2];
                        auVar73._12_4_ = auVar73._12_4_ + pfVar44[3];
                      }
                      fVar2 = auVar73._4_4_;
                      fVar72 = auVar73._8_4_;
                      fVar11 = auVar73._12_4_;
                      fVar28 = auVar80._4_4_;
                      fVar47 = auVar80._8_4_;
                      fVar1 = auVar80._12_4_;
                      switch((this->super_ConvolutionDepthWise).activation_type) {
                      case 1:
                        auVar80 = vmaxps_avx(auVar80,(undefined1  [16])0x0);
                        auVar73 = vmaxps_avx(auVar73,(undefined1  [16])0x0);
                        break;
                      case 2:
                        auVar148 = vmaxps_avx(auVar80,(undefined1  [16])0x0);
                        auVar173 = vminps_avx(auVar80,(undefined1  [16])0x0);
                        uVar37 = *(this->super_ConvolutionDepthWise).activation_params.data;
                        auVar156._4_4_ = uVar37;
                        auVar156._0_4_ = uVar37;
                        auVar156._8_4_ = uVar37;
                        auVar156._12_4_ = uVar37;
                        auVar80 = vfmadd213ps_fma(auVar173,auVar156,auVar148);
                        auVar148 = vmaxps_avx(auVar73,(undefined1  [16])0x0);
                        auVar173 = vminps_avx(auVar73,(undefined1  [16])0x0);
                        auVar73 = vfmadd213ps_fma(auVar173,auVar156,auVar148);
                        break;
                      case 3:
                        puVar29 = (undefined4 *)
                                  (this->super_ConvolutionDepthWise).activation_params.data;
                        uVar37 = *puVar29;
                        auVar93._4_4_ = uVar37;
                        auVar93._0_4_ = uVar37;
                        auVar93._8_4_ = uVar37;
                        auVar93._12_4_ = uVar37;
                        uVar37 = puVar29[1];
                        auVar154._4_4_ = uVar37;
                        auVar154._0_4_ = uVar37;
                        auVar154._8_4_ = uVar37;
                        auVar154._12_4_ = uVar37;
                        auVar148 = vmaxps_avx(auVar80,auVar93);
                        auVar80 = vminps_avx(auVar154,auVar148);
                        auVar148 = vmaxps_avx(auVar73,auVar93);
                        auVar73 = vminps_avx(auVar154,auVar148);
                        break;
                      case 4:
                        auVar81._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                        auVar81._8_4_ = -fVar47;
                        auVar81._12_4_ = -fVar1;
                        auVar144._8_4_ = 0x42b0c0a5;
                        auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar144._12_4_ = 0x42b0c0a5;
                        auVar148 = vminps_avx(auVar144,auVar81);
                        auVar130._8_4_ = 0xc2b0c0a5;
                        auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar130._12_4_ = 0xc2b0c0a5;
                        auVar160 = vmaxps_avx(auVar130,auVar148);
                        auVar82._8_4_ = 0x3fb8aa3b;
                        auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar82._12_4_ = 0x3fb8aa3b;
                        auVar50._8_4_ = 0x3f000000;
                        auVar50._0_8_ = 0x3f0000003f000000;
                        auVar50._12_4_ = 0x3f000000;
                        auVar148 = vfmadd213ps_fma(auVar82,auVar160,auVar50);
                        auVar94._0_4_ = (int)auVar148._0_4_;
                        auVar94._4_4_ = (int)auVar148._4_4_;
                        auVar94._8_4_ = (int)auVar148._8_4_;
                        auVar94._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar94);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar68._8_4_ = 0x3f800000;
                        auVar68._0_8_ = 0x3f8000003f800000;
                        auVar68._12_4_ = 0x3f800000;
                        auVar148 = vandps_avx(auVar148,auVar68);
                        auVar54 = vsubps_avx(auVar173,auVar148);
                        auVar127._8_4_ = 0x3f318000;
                        auVar127._0_8_ = 0x3f3180003f318000;
                        auVar127._12_4_ = 0x3f318000;
                        auVar148 = vfmsub231ps_fma(auVar160,auVar54,auVar127);
                        auVar175._8_4_ = 0xb95e8083;
                        auVar175._0_8_ = 0xb95e8083b95e8083;
                        auVar175._12_4_ = 0xb95e8083;
                        auVar173 = vfnmsub231ps_fma(auVar148,auVar54,auVar175);
                        auVar162._0_4_ = auVar173._0_4_ * auVar173._0_4_;
                        auVar162._4_4_ = auVar173._4_4_ * auVar173._4_4_;
                        auVar162._8_4_ = auVar173._8_4_ * auVar173._8_4_;
                        auVar162._12_4_ = auVar173._12_4_ * auVar173._12_4_;
                        auVar142._8_4_ = 0x39506967;
                        auVar142._0_8_ = 0x3950696739506967;
                        auVar142._12_4_ = 0x39506967;
                        auVar178._8_4_ = 0x3ab743ce;
                        auVar178._0_8_ = 0x3ab743ce3ab743ce;
                        auVar178._12_4_ = 0x3ab743ce;
                        auVar148 = vfmadd213ps_fma(auVar142,auVar173,auVar178);
                        auVar181._8_4_ = 0x3c088908;
                        auVar181._0_8_ = 0x3c0889083c088908;
                        auVar181._12_4_ = 0x3c088908;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar181);
                        auVar115._8_4_ = 0x3d2aa9c1;
                        auVar115._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar115._12_4_ = 0x3d2aa9c1;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar115);
                        auVar116._8_4_ = 0x3e2aaaaa;
                        auVar116._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar116._12_4_ = 0x3e2aaaaa;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar116);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar50);
                        auVar69 = vfmadd213ps_fma(auVar148,auVar162,auVar173);
                        auVar74._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
                        auVar74._8_4_ = -fVar72;
                        auVar74._12_4_ = -fVar11;
                        auVar148 = vminps_avx(auVar144,auVar74);
                        auVar160 = vmaxps_avx(auVar130,auVar148);
                        auVar155._8_4_ = 0x3fb8aa3b;
                        auVar155._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar155._12_4_ = 0x3fb8aa3b;
                        auVar148 = vfmadd213ps_fma(auVar155,auVar160,auVar50);
                        auVar163._0_4_ = (int)auVar148._0_4_;
                        auVar163._4_4_ = (int)auVar148._4_4_;
                        auVar163._8_4_ = (int)auVar148._8_4_;
                        auVar163._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar163);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar148 = vandps_avx(auVar148,auVar68);
                        auVar173 = vsubps_avx(auVar173,auVar148);
                        auVar148 = vfmsub231ps_fma(auVar160,auVar173,auVar127);
                        auVar160 = vfnmsub231ps_fma(auVar148,auVar173,auVar175);
                        auVar164._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                        auVar164._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                        auVar164._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                        auVar164._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                        auVar148 = vfmadd213ps_fma(auVar142,auVar160,auVar178);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar181);
                        auVar128._8_4_ = 0x3d2aa9c1;
                        auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar128._12_4_ = 0x3d2aa9c1;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar128);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar116);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar50);
                        auVar160 = vfmadd213ps_fma(auVar148,auVar164,auVar160);
                        auVar75._0_4_ = auVar69._0_4_ + 1.0;
                        auVar75._4_4_ = auVar69._4_4_ + 1.0;
                        auVar75._8_4_ = auVar69._8_4_ + 1.0;
                        auVar75._12_4_ = auVar69._12_4_ + 1.0;
                        auVar83._0_4_ = (int)auVar54._0_4_;
                        auVar83._4_4_ = (int)auVar54._4_4_;
                        auVar83._8_4_ = (int)auVar54._8_4_;
                        auVar83._12_4_ = (int)auVar54._12_4_;
                        auVar148 = vpslld_avx(auVar83,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar68);
                        auVar54 = vfmadd213ps_fma(auVar148,auVar75,auVar68);
                        auVar76._0_4_ = auVar160._0_4_ + 1.0;
                        auVar76._4_4_ = auVar160._4_4_ + 1.0;
                        auVar76._8_4_ = auVar160._8_4_ + 1.0;
                        auVar76._12_4_ = auVar160._12_4_ + 1.0;
                        auVar95._0_4_ = (int)auVar173._0_4_;
                        auVar95._4_4_ = (int)auVar173._4_4_;
                        auVar95._8_4_ = (int)auVar173._8_4_;
                        auVar95._12_4_ = (int)auVar173._12_4_;
                        auVar148 = vpslld_avx(auVar95,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar68);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar76,auVar68);
                        auVar80 = vdivps_avx(auVar68,auVar54);
                        auVar73 = vdivps_avx(auVar68,auVar148);
                        break;
                      case 5:
                        auVar48._8_4_ = 0x42b0c0a5;
                        auVar48._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar48._12_4_ = 0x42b0c0a5;
                        auVar148 = vminps_avx(auVar80,auVar48);
                        auVar179._8_4_ = 0xc2b0c0a5;
                        auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar179._12_4_ = 0xc2b0c0a5;
                        auVar160 = vmaxps_avx(auVar179,auVar148);
                        auVar146._8_4_ = 0x3fb8aa3b;
                        auVar146._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar146._12_4_ = 0x3fb8aa3b;
                        auVar129._8_4_ = 0x3f000000;
                        auVar129._0_8_ = 0x3f0000003f000000;
                        auVar129._12_4_ = 0x3f000000;
                        auVar148 = vfmadd213ps_fma(auVar146,auVar160,auVar129);
                        auVar158._0_4_ = (int)auVar148._0_4_;
                        auVar158._4_4_ = (int)auVar148._4_4_;
                        auVar158._8_4_ = (int)auVar148._8_4_;
                        auVar158._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar158);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar49._8_4_ = 0x3f800000;
                        auVar49._0_8_ = 0x3f8000003f800000;
                        auVar49._12_4_ = 0x3f800000;
                        auVar148 = vandps_avx(auVar148,auVar49);
                        auVar148 = vsubps_avx(auVar173,auVar148);
                        auVar97._8_4_ = 0x3f318000;
                        auVar97._0_8_ = 0x3f3180003f318000;
                        auVar97._12_4_ = 0x3f318000;
                        auVar173 = vfmsub231ps_fma(auVar160,auVar148,auVar97);
                        auVar98._8_4_ = 0xb95e8083;
                        auVar98._0_8_ = 0xb95e8083b95e8083;
                        auVar98._12_4_ = 0xb95e8083;
                        auVar160 = vfnmsub231ps_fma(auVar173,auVar148,auVar98);
                        auVar159._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                        auVar159._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                        auVar159._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                        auVar159._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                        auVar166._8_4_ = 0x39506967;
                        auVar166._0_8_ = 0x3950696739506967;
                        auVar166._12_4_ = 0x39506967;
                        auVar99._8_4_ = 0x3ab743ce;
                        auVar99._0_8_ = 0x3ab743ce3ab743ce;
                        auVar99._12_4_ = 0x3ab743ce;
                        auVar173 = vfmadd213ps_fma(auVar166,auVar160,auVar99);
                        auVar131._8_4_ = 0x3c088908;
                        auVar131._0_8_ = 0x3c0889083c088908;
                        auVar131._12_4_ = 0x3c088908;
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar131);
                        auVar143._8_4_ = 0x3d2aa9c1;
                        auVar143._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar143._12_4_ = 0x3d2aa9c1;
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar143);
                        auVar100._8_4_ = 0x3e2aaaaa;
                        auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar100._12_4_ = 0x3e2aaaaa;
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar100);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar129);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar159,auVar160);
                        auVar88._0_4_ = auVar173._0_4_ + 1.0;
                        auVar88._4_4_ = auVar173._4_4_ + 1.0;
                        auVar88._8_4_ = auVar173._8_4_ + 1.0;
                        auVar88._12_4_ = auVar173._12_4_ + 1.0;
                        auVar147._0_4_ = (int)auVar148._0_4_;
                        auVar147._4_4_ = (int)auVar148._4_4_;
                        auVar147._8_4_ = (int)auVar148._8_4_;
                        auVar147._12_4_ = (int)auVar148._12_4_;
                        auVar148 = vpslld_avx(auVar147,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar49);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar88,auVar49);
                        auVar173 = vcmpps_avx(auVar148,(undefined1  [16])0x0,2);
                        auVar101._8_4_ = 0x800000;
                        auVar101._0_8_ = 0x80000000800000;
                        auVar101._12_4_ = 0x800000;
                        auVar148 = vmaxps_avx(auVar148,auVar101);
                        auVar160 = vpsrld_avx(auVar148,0x17);
                        auVar118._8_4_ = 0x807fffff;
                        auVar118._0_8_ = 0x807fffff807fffff;
                        auVar118._12_4_ = 0x807fffff;
                        auVar148 = vandps_avx(auVar148,auVar118);
                        auVar69 = vorps_avx(auVar148,auVar129);
                        auVar119._8_4_ = 0xffffff82;
                        auVar119._0_8_ = 0xffffff82ffffff82;
                        auVar119._12_4_ = 0xffffff82;
                        auVar148 = vpaddd_avx(auVar160,auVar119);
                        auVar54 = vcvtdq2ps_avx(auVar148);
                        auVar120._8_4_ = 0x3f3504f3;
                        auVar120._0_8_ = 0x3f3504f33f3504f3;
                        auVar120._12_4_ = 0x3f3504f3;
                        auVar160 = vcmpps_avx(auVar69,auVar120,1);
                        auVar148 = vandps_avx(auVar160,auVar69);
                        auVar121._0_4_ = auVar69._0_4_ + -1.0 + auVar148._0_4_;
                        auVar121._4_4_ = auVar69._4_4_ + -1.0 + auVar148._4_4_;
                        auVar121._8_4_ = auVar69._8_4_ + -1.0 + auVar148._8_4_;
                        auVar121._12_4_ = auVar69._12_4_ + -1.0 + auVar148._12_4_;
                        auVar148 = vandps_avx(auVar160,auVar49);
                        auVar148 = vsubps_avx(auVar54,auVar148);
                        auVar161._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                        auVar161._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                        auVar161._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                        auVar161._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                        auVar167._8_4_ = 0x3d9021bb;
                        auVar167._0_8_ = 0x3d9021bb3d9021bb;
                        auVar167._12_4_ = 0x3d9021bb;
                        auVar132._8_4_ = 0xbdebd1b8;
                        auVar132._0_8_ = 0xbdebd1b8bdebd1b8;
                        auVar132._12_4_ = 0xbdebd1b8;
                        auVar160 = vfmadd213ps_fma(auVar167,auVar121,auVar132);
                        auVar133._8_4_ = 0x3def251a;
                        auVar133._0_8_ = 0x3def251a3def251a;
                        auVar133._12_4_ = 0x3def251a;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar133);
                        auVar134._8_4_ = 0xbdfe5d4f;
                        auVar134._0_8_ = 0xbdfe5d4fbdfe5d4f;
                        auVar134._12_4_ = 0xbdfe5d4f;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar134);
                        auVar135._8_4_ = 0x3e11e9bf;
                        auVar135._0_8_ = 0x3e11e9bf3e11e9bf;
                        auVar135._12_4_ = 0x3e11e9bf;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar135);
                        auVar136._8_4_ = 0xbe2aae50;
                        auVar136._0_8_ = 0xbe2aae50be2aae50;
                        auVar136._12_4_ = 0xbe2aae50;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar136);
                        auVar137._8_4_ = 0x3e4cceac;
                        auVar137._0_8_ = 0x3e4cceac3e4cceac;
                        auVar137._12_4_ = 0x3e4cceac;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar137);
                        auVar138._8_4_ = 0xbe7ffffc;
                        auVar138._0_8_ = 0xbe7ffffcbe7ffffc;
                        auVar138._12_4_ = 0xbe7ffffc;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar138);
                        auVar139._8_4_ = 0x3eaaaaaa;
                        auVar139._0_8_ = 0x3eaaaaaa3eaaaaaa;
                        auVar139._12_4_ = 0x3eaaaaaa;
                        auVar160 = vfmadd213ps_fma(auVar160,auVar121,auVar139);
                        auVar168._0_4_ = auVar161._0_4_ * auVar121._0_4_ * auVar160._0_4_;
                        auVar168._4_4_ = auVar161._4_4_ * auVar121._4_4_ * auVar160._4_4_;
                        auVar168._8_4_ = auVar161._8_4_ * auVar121._8_4_ * auVar160._8_4_;
                        auVar168._12_4_ = auVar161._12_4_ * auVar121._12_4_ * auVar160._12_4_;
                        auVar176._8_4_ = 0xb95e8083;
                        auVar176._0_8_ = 0xb95e8083b95e8083;
                        auVar176._12_4_ = 0xb95e8083;
                        auVar160 = vfmadd231ps_fma(auVar168,auVar148,auVar176);
                        auVar160 = vfmsub231ps_fma(auVar160,auVar129,auVar161);
                        auVar160 = vsubps_avx(auVar160,auVar121);
                        auVar148 = vfmsub231ps_fma(auVar160,auVar97,auVar148);
                        auVar122._0_4_ = auVar148._0_4_ * -2.0;
                        auVar122._4_4_ = auVar148._4_4_ * -2.0;
                        auVar122._8_4_ = auVar148._8_4_ * -2.0;
                        auVar122._12_4_ = auVar148._12_4_ * -2.0;
                        auVar55._8_4_ = 0x7fffffff;
                        auVar55._0_8_ = 0x7fffffff7fffffff;
                        auVar55._12_4_ = 0x7fffffff;
                        auVar148 = vblendvps_avx(auVar122,auVar55,auVar173);
                        auVar56._8_4_ = 0x42b0c0a5;
                        auVar56._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar56._12_4_ = 0x42b0c0a5;
                        auVar148 = vminps_avx(auVar148,auVar56);
                        auVar160 = vmaxps_avx(auVar179,auVar148);
                        auVar169._8_4_ = 0x3fb8aa3b;
                        auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar169._12_4_ = 0x3fb8aa3b;
                        auVar148 = vfmadd213ps_fma(auVar169,auVar160,auVar129);
                        auVar149._0_4_ = (int)auVar148._0_4_;
                        auVar149._4_4_ = (int)auVar148._4_4_;
                        auVar149._8_4_ = (int)auVar148._8_4_;
                        auVar149._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar149);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar148 = vandps_avx(auVar148,auVar49);
                        _local_1d8 = vsubps_avx(auVar173,auVar148);
                        auVar148 = vfmsub231ps_fma(auVar160,_local_1d8,auVar97);
                        auVar173 = vfnmsub231ps_fma(auVar148,_local_1d8,auVar176);
                        auVar150._0_4_ = auVar173._0_4_ * auVar173._0_4_;
                        auVar150._4_4_ = auVar173._4_4_ * auVar173._4_4_;
                        auVar150._8_4_ = auVar173._8_4_ * auVar173._8_4_;
                        auVar150._12_4_ = auVar173._12_4_ * auVar173._12_4_;
                        auVar89._8_4_ = 0x39506967;
                        auVar89._0_8_ = 0x3950696739506967;
                        auVar89._12_4_ = 0x39506967;
                        auVar57._8_4_ = 0x3ab743ce;
                        auVar57._0_8_ = 0x3ab743ce3ab743ce;
                        auVar57._12_4_ = 0x3ab743ce;
                        auVar148 = vfmadd213ps_fma(auVar89,auVar173,auVar57);
                        auVar102._8_4_ = 0x3c088908;
                        auVar102._0_8_ = 0x3c0889083c088908;
                        auVar102._12_4_ = 0x3c088908;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar102);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar143);
                        auVar140._8_4_ = 0x3e2aaaaa;
                        auVar140._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar140._12_4_ = 0x3e2aaaaa;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar140);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar173,auVar129);
                        auVar69 = vfmadd213ps_fma(auVar148,auVar150,auVar173);
                        auVar123._8_4_ = 0x42b0c0a5;
                        auVar123._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar123._12_4_ = 0x42b0c0a5;
                        auVar148 = vminps_avx(auVar73,auVar123);
                        auVar160 = vmaxps_avx(auVar179,auVar148);
                        auVar148 = vfmadd213ps_fma(auVar169,auVar160,auVar129);
                        auVar170._0_4_ = (int)auVar148._0_4_;
                        auVar170._4_4_ = (int)auVar148._4_4_;
                        auVar170._8_4_ = (int)auVar148._8_4_;
                        auVar170._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar170);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar148 = vandps_avx(auVar148,auVar49);
                        auVar148 = vsubps_avx(auVar173,auVar148);
                        auVar171._8_4_ = 0x3f318000;
                        auVar171._0_8_ = 0x3f3180003f318000;
                        auVar171._12_4_ = 0x3f318000;
                        auVar173 = vfmsub231ps_fma(auVar160,auVar148,auVar171);
                        auVar160 = vfnmsub231ps_fma(auVar173,auVar148,auVar176);
                        auVar172._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                        auVar172._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                        auVar172._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                        auVar172._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                        auVar173 = vfmadd213ps_fma(auVar89,auVar160,auVar57);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar102);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar143);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar140);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar160,auVar129);
                        auVar173 = vfmadd213ps_fma(auVar173,auVar172,auVar160);
                        auVar124._0_4_ = auVar173._0_4_ + 1.0;
                        auVar124._4_4_ = auVar173._4_4_ + 1.0;
                        auVar124._8_4_ = auVar173._8_4_ + 1.0;
                        auVar124._12_4_ = auVar173._12_4_ + 1.0;
                        auVar151._0_4_ = (int)auVar148._0_4_;
                        auVar151._4_4_ = (int)auVar148._4_4_;
                        auVar151._8_4_ = (int)auVar148._8_4_;
                        auVar151._12_4_ = (int)auVar148._12_4_;
                        auVar148 = vpslld_avx(auVar151,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar49);
                        auVar70 = vfmadd213ps_fma(auVar148,auVar124,auVar49);
                        auVar58._8_4_ = 0x800000;
                        auVar58._0_8_ = 0x80000000800000;
                        auVar58._12_4_ = 0x800000;
                        auVar148 = vmaxps_avx(auVar70,auVar58);
                        auVar173 = vpsrld_avx(auVar148,0x17);
                        auVar59._8_4_ = 0x807fffff;
                        auVar59._0_8_ = 0x807fffff807fffff;
                        auVar59._12_4_ = 0x807fffff;
                        auVar148 = vandps_avx(auVar148,auVar59);
                        auVar54 = vorps_avx(auVar129,auVar148);
                        auVar60._8_4_ = 0xffffff82;
                        auVar60._0_8_ = 0xffffff82ffffff82;
                        auVar60._12_4_ = 0xffffff82;
                        auVar148 = vpaddd_avx(auVar173,auVar60);
                        auVar160 = vcvtdq2ps_avx(auVar148);
                        auVar61._8_4_ = 0x3f3504f3;
                        auVar61._0_8_ = 0x3f3504f33f3504f3;
                        auVar61._12_4_ = 0x3f3504f3;
                        auVar173 = vcmpps_avx(auVar54,auVar61,1);
                        auVar148 = vandps_avx(auVar173,auVar54);
                        auVar125._0_4_ = auVar148._0_4_ + auVar54._0_4_ + -1.0;
                        auVar125._4_4_ = auVar148._4_4_ + auVar54._4_4_ + -1.0;
                        auVar125._8_4_ = auVar148._8_4_ + auVar54._8_4_ + -1.0;
                        auVar125._12_4_ = auVar148._12_4_ + auVar54._12_4_ + -1.0;
                        auVar148 = vandps_avx(auVar173,auVar49);
                        auVar173 = vsubps_avx(auVar160,auVar148);
                        auVar177._0_4_ = auVar125._0_4_ * auVar125._0_4_;
                        auVar177._4_4_ = auVar125._4_4_ * auVar125._4_4_;
                        auVar177._8_4_ = auVar125._8_4_ * auVar125._8_4_;
                        auVar177._12_4_ = auVar125._12_4_ * auVar125._12_4_;
                        auVar180._8_4_ = 0x3d9021bb;
                        auVar180._0_8_ = 0x3d9021bb3d9021bb;
                        auVar180._12_4_ = 0x3d9021bb;
                        auVar103._8_4_ = 0xbdebd1b8;
                        auVar103._0_8_ = 0xbdebd1b8bdebd1b8;
                        auVar103._12_4_ = 0xbdebd1b8;
                        auVar148 = vfmadd213ps_fma(auVar180,auVar125,auVar103);
                        auVar104._8_4_ = 0x3def251a;
                        auVar104._0_8_ = 0x3def251a3def251a;
                        auVar104._12_4_ = 0x3def251a;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar104);
                        auVar105._8_4_ = 0xbdfe5d4f;
                        auVar105._0_8_ = 0xbdfe5d4fbdfe5d4f;
                        auVar105._12_4_ = 0xbdfe5d4f;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar105);
                        auVar106._8_4_ = 0x3e11e9bf;
                        auVar106._0_8_ = 0x3e11e9bf3e11e9bf;
                        auVar106._12_4_ = 0x3e11e9bf;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar106);
                        auVar107._8_4_ = 0xbe2aae50;
                        auVar107._0_8_ = 0xbe2aae50be2aae50;
                        auVar107._12_4_ = 0xbe2aae50;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar107);
                        auVar108._8_4_ = 0x3e4cceac;
                        auVar108._0_8_ = 0x3e4cceac3e4cceac;
                        auVar108._12_4_ = 0x3e4cceac;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar108);
                        auVar109._8_4_ = 0xbe7ffffc;
                        auVar109._0_8_ = 0xbe7ffffcbe7ffffc;
                        auVar109._12_4_ = 0xbe7ffffc;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar109);
                        auVar110._8_4_ = 0x3eaaaaaa;
                        auVar110._0_8_ = 0x3eaaaaaa3eaaaaaa;
                        auVar110._12_4_ = 0x3eaaaaaa;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar125,auVar110);
                        auVar111._0_4_ = auVar148._0_4_ * auVar177._0_4_ * auVar125._0_4_;
                        auVar111._4_4_ = auVar148._4_4_ * auVar177._4_4_ * auVar125._4_4_;
                        auVar111._8_4_ = auVar148._8_4_ * auVar177._8_4_ * auVar125._8_4_;
                        auVar111._12_4_ = auVar148._12_4_ * auVar177._12_4_ * auVar125._12_4_;
                        auVar90._8_4_ = 0xb95e8083;
                        auVar90._0_8_ = 0xb95e8083b95e8083;
                        auVar90._12_4_ = 0xb95e8083;
                        auVar148 = vfmadd231ps_fma(auVar111,auVar173,auVar90);
                        auVar160 = vfmsub231ps_fma(auVar148,auVar129,auVar177);
                        auVar148 = vcmpps_avx(auVar70,(undefined1  [16])0x0,2);
                        auVar160 = vsubps_avx(auVar160,auVar125);
                        auVar141._8_4_ = 0x3f318000;
                        auVar141._0_8_ = 0x3f3180003f318000;
                        auVar141._12_4_ = 0x3f318000;
                        auVar173 = vfmsub231ps_fma(auVar160,auVar141,auVar173);
                        auVar112._0_4_ = auVar173._0_4_ * -2.0;
                        auVar112._4_4_ = auVar173._4_4_ * -2.0;
                        auVar112._8_4_ = auVar173._8_4_ * -2.0;
                        auVar112._12_4_ = auVar173._12_4_ * -2.0;
                        auVar62._8_4_ = 0x7fffffff;
                        auVar62._0_8_ = 0x7fffffff7fffffff;
                        auVar62._12_4_ = 0x7fffffff;
                        auVar148 = vblendvps_avx(auVar112,auVar62,auVar148);
                        auVar63._8_4_ = 0x42b0c0a5;
                        auVar63._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar63._12_4_ = 0x42b0c0a5;
                        auVar148 = vminps_avx(auVar148,auVar63);
                        auVar160 = vmaxps_avx(auVar179,auVar148);
                        auVar126._8_4_ = 0x3fb8aa3b;
                        auVar126._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar126._12_4_ = 0x3fb8aa3b;
                        auVar148 = vfmadd213ps_fma(auVar126,auVar160,auVar129);
                        auVar152._0_4_ = (int)auVar148._0_4_;
                        auVar152._4_4_ = (int)auVar148._4_4_;
                        auVar152._8_4_ = (int)auVar148._8_4_;
                        auVar152._12_4_ = (int)auVar148._12_4_;
                        auVar173 = vcvtdq2ps_avx(auVar152);
                        auVar148 = vcmpps_avx(auVar148,auVar173,1);
                        auVar148 = vandps_avx(auVar148,auVar49);
                        auVar173 = vsubps_avx(auVar173,auVar148);
                        auVar148 = vfmsub231ps_fma(auVar160,auVar173,auVar141);
                        auVar160 = vfnmsub231ps_fma(auVar148,auVar173,auVar90);
                        auVar153._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                        auVar153._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                        auVar153._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                        auVar153._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                        auVar174._8_4_ = 0x39506967;
                        auVar174._0_8_ = 0x3950696739506967;
                        auVar174._12_4_ = 0x39506967;
                        auVar64._8_4_ = 0x3ab743ce;
                        auVar64._0_8_ = 0x3ab743ce3ab743ce;
                        auVar64._12_4_ = 0x3ab743ce;
                        auVar148 = vfmadd213ps_fma(auVar174,auVar160,auVar64);
                        auVar65._8_4_ = 0x3c088908;
                        auVar65._0_8_ = 0x3c0889083c088908;
                        auVar65._12_4_ = 0x3c088908;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar65);
                        auVar66._8_4_ = 0x3d2aa9c1;
                        auVar66._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar66._12_4_ = 0x3d2aa9c1;
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar66);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar140);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar160,auVar129);
                        auVar160 = vfmadd213ps_fma(auVar148,auVar153,auVar160);
                        auVar113._0_4_ = auVar69._0_4_ + 1.0;
                        auVar113._4_4_ = auVar69._4_4_ + 1.0;
                        auVar113._8_4_ = auVar69._8_4_ + 1.0;
                        auVar113._12_4_ = auVar69._12_4_ + 1.0;
                        auVar91._0_4_ = (int)(float)local_1d8._0_4_;
                        auVar91._4_4_ = (int)(float)local_1d8._4_4_;
                        auVar91._8_4_ = (int)fStack_1d0;
                        auVar91._12_4_ = (int)fStack_1cc;
                        auVar148 = vpslld_avx(auVar91,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar49);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar113,auVar49);
                        auVar67._8_4_ = 0x40000000;
                        auVar67._0_8_ = 0x4000000040000000;
                        auVar67._12_4_ = 0x40000000;
                        auVar148 = vdivps_avx(auVar67,auVar148);
                        auVar80 = vfmsub231ps_fma(auVar80,auVar80,auVar148);
                        auVar92._0_4_ = auVar160._0_4_ + 1.0;
                        auVar92._4_4_ = auVar160._4_4_ + 1.0;
                        auVar92._8_4_ = auVar160._8_4_ + 1.0;
                        auVar92._12_4_ = auVar160._12_4_ + 1.0;
                        auVar114._0_4_ = (int)auVar173._0_4_;
                        auVar114._4_4_ = (int)auVar173._4_4_;
                        auVar114._8_4_ = (int)auVar173._8_4_;
                        auVar114._12_4_ = (int)auVar173._12_4_;
                        auVar148 = vpslld_avx(auVar114,0x17);
                        auVar148 = vpaddd_avx(auVar148,auVar49);
                        auVar148 = vfmadd213ps_fma(auVar148,auVar92,auVar49);
                        auVar148 = vdivps_avx(auVar67,auVar148);
                        auVar73 = vfmsub231ps_fma(auVar73,auVar73,auVar148);
                        break;
                      case 6:
                        puVar29 = (undefined4 *)
                                  (this->super_ConvolutionDepthWise).activation_params.data;
                        uVar37 = *puVar29;
                        auVar96._4_4_ = uVar37;
                        auVar96._0_4_ = uVar37;
                        auVar96._8_4_ = uVar37;
                        auVar96._12_4_ = uVar37;
                        uVar37 = puVar29[1];
                        auVar117._4_4_ = uVar37;
                        auVar117._0_4_ = uVar37;
                        auVar117._8_4_ = uVar37;
                        auVar117._12_4_ = uVar37;
                        auVar148 = vfmadd213ps_fma(auVar80,auVar96,auVar117);
                        auVar148 = vmaxps_avx(auVar148,(undefined1  [16])0x0);
                        auVar51._8_4_ = 0x3f800000;
                        auVar51._0_8_ = 0x3f8000003f800000;
                        auVar51._12_4_ = 0x3f800000;
                        auVar148 = vminps_avx(auVar148,auVar51);
                        auVar80._0_4_ = auVar148._0_4_ * auVar80._0_4_;
                        auVar80._4_4_ = auVar148._4_4_ * fVar28;
                        auVar80._8_4_ = auVar148._8_4_ * fVar47;
                        auVar80._12_4_ = auVar148._12_4_ * fVar1;
                        auVar148 = vfmadd213ps_fma(auVar96,auVar73,auVar117);
                        auVar148 = vmaxps_avx(auVar148,(undefined1  [16])0x0);
                        auVar148 = vminps_avx(auVar148,auVar51);
                        auVar73._0_4_ = auVar148._0_4_ * auVar73._0_4_;
                        auVar73._4_4_ = auVar148._4_4_ * fVar2;
                        auVar73._8_4_ = auVar148._8_4_ * fVar72;
                        auVar73._12_4_ = auVar148._12_4_ * fVar11;
                      }
                      if (iVar3 < 0x65) {
                        *pauVar34 = auVar80;
                        pauVar34[1] = auVar73;
                        pauVar34 = pauVar34 + 2;
                      }
                      else {
                        pvVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                        pfVar44 = (float *)((long)pvVar6 + local_2f0 * 0x20);
                        auVar84._0_4_ = auVar80._0_4_ * *pfVar44;
                        auVar84._4_4_ = auVar80._4_4_ * pfVar44[1];
                        auVar84._8_4_ = auVar80._8_4_ * pfVar44[2];
                        auVar84._12_4_ = auVar80._12_4_ * pfVar44[3];
                        pfVar44 = (float *)((long)pvVar6 + local_2f0 * 0x20 + 0x10);
                        auVar77._0_4_ = auVar73._0_4_ * *pfVar44;
                        auVar77._4_4_ = auVar73._4_4_ * pfVar44[1];
                        auVar77._8_4_ = auVar73._8_4_ * pfVar44[2];
                        auVar77._12_4_ = auVar73._12_4_ * pfVar44[3];
                        auVar52._8_4_ = 0x80000000;
                        auVar52._0_8_ = 0x8000000080000000;
                        auVar52._12_4_ = 0x80000000;
                        auVar148 = vandps_avx(auVar84,auVar52);
                        auVar173 = vandps_avx(auVar77,auVar52);
                        auVar53._8_4_ = 0x3f000000;
                        auVar53._0_8_ = 0x3f0000003f000000;
                        auVar53._12_4_ = 0x3f000000;
                        auVar148 = vorps_avx(auVar148,auVar53);
                        auVar173 = vorps_avx(auVar173,auVar53);
                        auVar85._0_4_ = (int)(auVar84._0_4_ + auVar148._0_4_);
                        auVar85._4_4_ = (int)(auVar84._4_4_ + auVar148._4_4_);
                        auVar85._8_4_ = (int)(auVar84._8_4_ + auVar148._8_4_);
                        auVar85._12_4_ = (int)(auVar84._12_4_ + auVar148._12_4_);
                        auVar78._0_4_ = (int)(auVar77._0_4_ + auVar173._0_4_);
                        auVar78._4_4_ = (int)(auVar77._4_4_ + auVar173._4_4_);
                        auVar78._8_4_ = (int)(auVar77._8_4_ + auVar173._8_4_);
                        auVar78._12_4_ = (int)(auVar77._12_4_ + auVar173._12_4_);
                        auVar148 = vpackssdw_avx(auVar85,auVar78);
                        auVar148 = vpminsw_avx(auVar148,_DAT_005ad0b0);
                        auVar148 = vpmaxsw_avx(auVar148,_DAT_005ad0c0);
                        auVar148 = vpacksswb_avx(auVar148,auVar148);
                        *(long *)*pauVar32 = auVar148._0_8_;
                        pauVar32 = (undefined1 (*) [16])((long)*pauVar32 + 8);
                      }
                      bVar46 = iVar31 != iVar33;
                      iVar31 = iVar31 + 1;
                    } while (bVar46);
                  }
                  uVar35 = (ulong)(iVar36 + 1);
                } while (iVar36 != (int)local_230);
              }
              local_2f0 = local_2f0 + 1;
              iVar42 = iVar42 + (int)local_27c;
            } while (local_2f0 != local_290);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            uVar45 = local_2d8._16_8_ - local_2d8._0_8_;
            pfVar41 = (pointer)local_2d8._0_8_;
LAB_003efdb6:
            operator_delete(pfVar41,uVar45);
          }
LAB_003f0dbe:
          iVar31 = 0;
        }
      }
    }
    else {
      uVar26 = (this->super_ConvolutionDepthWise).num_output;
      iVar33 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar45 = 1;
      if (opt->use_packing_layout == true) {
        if (iVar33 < 0x65) {
          uVar45 = (ulong)((uint)((uVar26 & 3) == 0) * 3 + 1);
        }
        else {
          uVar45 = 1;
          if ((uVar26 & 7) == 0) {
            uVar45 = 8;
          }
        }
      }
      local_290 = CONCAT44(local_290._4_4_,local_228.elempack);
      uVar12 = (uint)uVar45;
      uVar35 = (ulong)(uVar12 * 4);
      if (100 < iVar33) {
        uVar35 = uVar45;
      }
      local_1d8._0_4_ = iVar36;
      local_288 = CONCAT44(local_288._4_4_,iVar42);
      Mat::create(top_blob,iVar36,iVar42,(int)uVar26 / (int)uVar12,uVar35,uVar12,opt->blob_allocator
                 );
      auVar19 = stack0xfffffffffffffd48;
      iVar31 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar42 = (this->super_ConvolutionDepthWise).group;
        uVar40 = (int)uVar40 / iVar42;
        uVar25 = (this->super_ConvolutionDepthWise).num_output / iVar42;
        iVar42 = 1;
        uVar26 = 1;
        if (opt->use_packing_layout == true) {
          iVar42 = 1;
          if ((uVar40 & 7) == 0) {
            iVar42 = 8;
          }
          if (iVar33 < 0x65) {
            uVar26 = (uint)((uVar25 & 3) == 0) * 3 + 1;
          }
          else {
            uVar26 = 1;
            if ((uVar25 & 7) == 0) {
              uVar26 = 8;
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        local_2d8._12_4_ = local_228.refcount._4_4_;
        local_2d8._8_4_ = local_228.refcount._0_4_;
        local_2d8._0_8_ = local_228.data;
        local_2d8._16_8_ = local_228.elemsize;
        local_2d8._24_4_ = local_228.elempack;
        uStack_2b0._4_4_ = local_228.w;
        uStack_2b0._0_4_ = local_228.dims;
        uStack_2a8._4_4_ = local_228.d;
        uStack_2a8._0_4_ = local_228.h;
        local_2d8._32_8_ = local_228.allocator;
        uStack_29c = auVar19._28_4_;
        iStack_2a0 = local_228.c;
        local_298 = local_228.cstep;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if (iVar42 < (int)local_290) {
          local_278.data = *(void **)opt;
          local_278.elemsize = (size_t)opt->workspace_allocator;
          local_278.elempack = opt->openmp_blocktime;
          local_278._28_1_ = opt->use_winograd_convolution;
          local_278._29_1_ = opt->use_sgemm_convolution;
          local_278._30_1_ = opt->use_int8_inference;
          local_278._31_1_ = opt->use_vulkan_compute;
          local_278.allocator = *(Allocator **)&opt->use_bf16_storage;
          local_278._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
          local_278._48_8_ = *(undefined8 *)&opt->flush_denormals;
          local_278._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
          local_278.refcount = (int *)opt->workspace_allocator;
          convert_packing(&local_228,(Mat *)local_2d8,iVar42,(Option *)&local_278);
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            if ((long)iStack_2a0 * local_298 != 0) goto LAB_003f019b;
          }
          iVar31 = -100;
        }
        else {
LAB_003f019b:
          piVar4 = top_blob->refcount;
          local_278.data = top_blob->data;
          local_278.refcount = top_blob->refcount;
          local_278.elemsize = top_blob->elemsize;
          local_278.elempack = top_blob->elempack;
          local_278.allocator = top_blob->allocator;
          local_278.dims = top_blob->dims;
          local_278.w = top_blob->w;
          local_278.h = top_blob->h;
          local_278.d = top_blob->d;
          local_278.c = top_blob->c;
          local_278.cstep = top_blob->cstep;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          if (uVar26 < uVar12) {
            local_2f0._0_1_ = (byte)uVar45;
            Mat::create(&local_278,local_1d8._0_4_,(int)local_288,
                        (this->super_ConvolutionDepthWise).num_output / (int)uVar26,
                        (ulong)((byte)((ushort)uVar35 / (ushort)(byte)local_2f0) * uVar26),uVar26,
                        opt->workspace_allocator);
            iVar31 = -100;
            if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0))
            goto LAB_003f0278;
          }
          else {
LAB_003f0278:
            if (0 < (this->super_ConvolutionDepthWise).group) {
              local_1d8._0_4_ = (int)uVar40 / iVar42;
              local_288 = CONCAT44(local_288._4_4_,(int)uVar25 / (int)uVar26);
              iVar33 = 0;
              iVar36 = 0;
              lVar27 = 0;
              do {
                auVar19 = stack0xfffffffffffffd48;
                local_1c0 = (pointer)((long)(iVar33 / iVar42) * local_298 * local_2d8._16_8_ +
                                     local_2d8._0_8_);
                local_1b8 = (int *)0x0;
                local_1b0 = (Allocator *)local_2d8._16_8_;
                local_1a8 = local_2d8._24_4_;
                local_1a0 = (Allocator *)local_2d8._32_8_;
                local_188 = local_1d8._0_4_;
                uVar18 = uStack_2b0;
                uVar20 = uStack_2a8;
                local_180 = ((long)uStack_2a8._4_4_ * local_2d8._16_8_ *
                             (long)(int)uStack_2a8 * (long)uStack_2b0._4_4_ + 0xfU &
                            0xfffffffffffffff0) / (ulong)local_2d8._16_8_;
                uStack_2b0._0_4_ = (int)uVar18;
                uStack_2b0._4_4_ = SUB84(uVar18,4);
                local_198 = (int)uStack_2b0;
                iStack_194 = uStack_2b0._4_4_;
                uStack_2a8._0_4_ = (int)uVar20;
                uStack_2a8._4_4_ = SUB84(uVar20,4);
                iStack_190 = (int)uStack_2a8;
                iStack_18c = uStack_2a8._4_4_;
                local_120 = (void *)((long)(iVar36 / (int)uVar26) * local_278.cstep *
                                     local_278.elemsize + (long)local_278.data);
                local_118 = (int *)0x0;
                local_110 = (Allocator *)local_278.elemsize;
                local_108 = local_278.elempack;
                local_100 = local_278.allocator;
                local_e8 = (int)local_288;
                local_e0 = ((long)local_278.d * local_278.elemsize *
                            (long)local_278.h * (long)local_278.w + 0xf & 0xfffffffffffffff0) /
                           local_278.elemsize;
                local_f8 = local_278.dims;
                iStack_f4 = local_278.w;
                iStack_f0 = local_278.h;
                iStack_ec = local_278.d;
                pLVar10 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar27];
                local_78._0_1_ = opt->lightmode;
                local_78._1_1_ = opt->use_shader_pack8;
                local_78._2_1_ = opt->use_subgroup_ops;
                local_78._3_1_ = opt->use_reserved_0;
                local_78._4_4_ = opt->num_threads;
                pAStack_68 = opt->workspace_allocator;
                uStack_60._0_4_ = opt->openmp_blocktime;
                uStack_60._4_1_ = opt->use_winograd_convolution;
                uStack_60._5_1_ = opt->use_sgemm_convolution;
                uStack_60._6_1_ = opt->use_int8_inference;
                uStack_60._7_1_ = opt->use_vulkan_compute;
                local_58._0_1_ = opt->use_bf16_storage;
                local_58._1_1_ = opt->use_fp16_packed;
                local_58._2_1_ = opt->use_fp16_storage;
                local_58._3_1_ = opt->use_fp16_arithmetic;
                local_58._4_1_ = opt->use_int8_packed;
                local_58._5_1_ = opt->use_int8_storage;
                local_58._6_1_ = opt->use_int8_arithmetic;
                local_58._7_1_ = opt->use_packing_layout;
                uStack_50._0_4_ = opt->vulkan_device_index;
                uStack_50._4_1_ = opt->use_reserved_1;
                uStack_50._5_1_ = opt->use_image_storage;
                uStack_50._6_1_ = opt->use_tensor_storage;
                uStack_50._7_1_ = opt->use_reserved_2;
                uStack_48._0_4_ = opt->flush_denormals;
                uStack_48._4_1_ = opt->use_local_pool_allocator;
                uStack_48._5_1_ = opt->use_shader_local_memory;
                uStack_48._6_1_ = opt->use_cooperative_matrix;
                uStack_48._7_1_ = opt->use_winograd23_convolution;
                uStack_40._0_1_ = opt->use_winograd43_convolution;
                uStack_40._1_1_ = opt->use_winograd63_convolution;
                uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                uStack_40._3_1_ = opt->use_fp16_uniform;
                uStack_40._4_1_ = opt->use_int8_uniform;
                uStack_40._5_1_ = opt->use_reserved_9;
                uStack_40._6_1_ = opt->use_reserved_10;
                uStack_40._7_1_ = opt->use_reserved_11;
                pAStack_70 = local_278.allocator;
                unique0x10004ecf = auVar19;
                iVar31 = (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1c0,&local_120,&local_78);
                if (local_118 != (int *)0x0) {
                  LOCK();
                  *local_118 = *local_118 + -1;
                  UNLOCK();
                  if (*local_118 == 0) {
                    if (local_100 == (Allocator *)0x0) {
                      if (local_120 != (void *)0x0) {
                        free(local_120);
                      }
                    }
                    else {
                      (*local_100->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_1b8 != (int *)0x0) {
                  LOCK();
                  *local_1b8 = *local_1b8 + -1;
                  UNLOCK();
                  if (*local_1b8 == 0) {
                    if (local_1a0 == (Allocator *)0x0) {
                      if (local_1c0 != (pointer)0x0) {
                        free(local_1c0);
                      }
                    }
                    else {
                      (*local_1a0->_vptr_Allocator[3])();
                    }
                  }
                }
                if (iVar31 != 0) goto LAB_003f0e27;
                lVar27 = lVar27 + 1;
                iVar36 = iVar36 + uVar25;
                iVar33 = iVar33 + uVar40;
              } while (lVar27 < (this->super_ConvolutionDepthWise).group);
            }
            if (uVar26 < uVar12) {
              convert_packing(&local_278,top_blob,uVar12,opt);
              iVar31 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              goto LAB_003f0e27;
            }
            else if (&local_278 != top_blob) {
              if ((Allocator *)local_278.refcount != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_278.refcount =
                     *(int *)(_func_int ***)local_278.refcount + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = local_278.data;
              top_blob->refcount = local_278.refcount;
              top_blob->elemsize = local_278.elemsize;
              top_blob->elempack = local_278.elempack;
              top_blob->allocator = local_278.allocator;
              top_blob->dims = local_278.dims;
              top_blob->w = local_278.w;
              top_blob->h = local_278.h;
              top_blob->d = local_278.d;
              top_blob->c = local_278.c;
              top_blob->cstep = local_278.cstep;
            }
            iVar31 = 0;
          }
LAB_003f0e27:
          if ((Allocator *)local_278.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_278.refcount =
                 *(int *)(_func_int ***)local_278.refcount + -1;
            UNLOCK();
            if (*(int *)(_func_int ***)local_278.refcount == 0) {
              if (local_278.allocator == (Allocator *)0x0) {
                if (local_278.data != (void *)0x0) {
                  free(local_278.data);
                }
              }
              else {
                (*(local_278.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if ((Allocator *)local_2d8._8_8_ != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_2d8._8_8_ = *(int *)(_func_int ***)local_2d8._8_8_ + -1;
          UNLOCK();
          if (*(int *)(_func_int ***)local_2d8._8_8_ == 0) {
            if ((Allocator *)local_2d8._32_8_ == (Allocator *)0x0) {
              if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
                free((void *)local_2d8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_2d8._32_8_)[3])();
            }
          }
        }
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003f0eea:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}